

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O2

ArrayPtr<const_capnp::word>
capnp::initMessageBuilderFromFlatArrayCopy
          (ArrayPtr<const_capnp::word> array,MessageBuilder *target,ReaderOptions options)

{
  ArrayPtr<const_capnp::word> AVar1;
  FlatArrayMessageReader reader;
  Reader local_140;
  FlatArrayMessageReader local_120;
  
  FlatArrayMessageReader::FlatArrayMessageReader(&local_120,array,options);
  MessageReader::getRootInternal(&local_140,&local_120.super_MessageReader);
  MessageBuilder::setRoot<capnp::AnyPointer::Reader>(target,&local_140);
  FlatArrayMessageReader::~FlatArrayMessageReader(&local_120);
  AVar1.size_ = (long)((long)array.ptr + (array.size_ * 8 - (long)local_120.end)) >> 3;
  AVar1.ptr = local_120.end;
  return AVar1;
}

Assistant:

kj::ArrayPtr<const word> initMessageBuilderFromFlatArrayCopy(
    kj::ArrayPtr<const word> array, MessageBuilder& target, ReaderOptions options) {
  FlatArrayMessageReader reader(array, options);
  target.setRoot(reader.getRoot<AnyPointer>());
  return kj::arrayPtr(reader.getEnd(), array.end());
}